

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void __thiscall
serialize_tests::OtherParamChecker::
Unserialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
          (OtherParamChecker *this,
          ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
          *s)

{
  uint8_t uVar1;
  size_t in_RCX;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  lazy_ostream local_f8;
  undefined1 *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  uint8_t value;
  uint8_t param;
  uint8_t *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined1 *local_98;
  uint8_t **local_90;
  uint8_t *local_88;
  uint8_t obj;
  undefined1 local_78;
  undefined1 *local_70;
  uint8_t **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = ((s->m_substream).m_params)->param;
  param = uVar1;
  DataStream::read((s->m_substream).m_substream.m_substream,(int)&obj,(void *)0x1,in_RCX);
  value = obj;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17f;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f8.m_empty = false;
  local_f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(obj == uVar1);
  local_e0 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_68 = &local_88;
  local_78 = 0;
  _obj = &PTR__lazy_ostream_01389a40;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_b0 = &param;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_01389a40;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_88 = &value;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f8,1,2,REQUIRE,0xe299b5,(size_t)&local_60,0x17f,&obj,"param",&local_a8
            );
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s) const
    {
        const uint8_t param = s.template GetParams<OtherParam>().param;
        uint8_t value;
        s >> value;
        BOOST_CHECK_EQUAL(value, param);
    }